

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_matcher.hpp
# Opt level: O2

bool duckdb::SetMatcher::Match<duckdb::Expression,duckdb::ExpressionMatcher>
               (vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_true>
                *matchers,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *entries,vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,
               Policy policy)

{
  pointer puVar1;
  bool bVar2;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *entry;
  pointer this;
  vector<std::reference_wrapper<duckdb::Expression>,_true> ptr_entries;
  reference_wrapper<duckdb::Expression> local_50;
  _Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = (entries->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this = (entries->
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start; this != puVar1; this = this + 1) {
    local_50._M_data =
         unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                   (this);
    ::std::
    vector<std::reference_wrapper<duckdb::Expression>,std::allocator<std::reference_wrapper<duckdb::Expression>>>
    ::emplace_back<std::reference_wrapper<duckdb::Expression>>
              ((vector<std::reference_wrapper<duckdb::Expression>,std::allocator<std::reference_wrapper<duckdb::Expression>>>
                *)&local_48,&local_50);
  }
  bVar2 = Match<duckdb::Expression,duckdb::ExpressionMatcher>
                    (matchers,(vector<std::reference_wrapper<duckdb::Expression>,_true> *)&local_48,
                     bindings,policy);
  ::std::
  _Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  ::~_Vector_base(&local_48);
  return bVar2;
}

Assistant:

static bool Match(vector<unique_ptr<MATCHER>> &matchers, vector<unique_ptr<T>> &entries,
	                  vector<reference<T>> &bindings, Policy policy) {
		// convert vector of unique_ptr to vector of normal pointers
		vector<reference<T>> ptr_entries;
		for (auto &entry : entries) {
			ptr_entries.push_back(*entry);
		}
		// then just call the normal match function
		return Match(matchers, ptr_entries, bindings, policy);
	}